

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

bool __thiscall
cs_impl::
cni_helper<bool_(*)(const_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_bool_(*)(const_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
::_call<0>(cni_helper<bool_(*)(const_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_bool_(*)(const_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
           *this,vector *args,sequence<0> *param_3)

{
  bool *pbVar1;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RSI;
  list<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDI;
  var *in_stack_00000100;
  undefined7 in_stack_ffffffffffffffe0;
  bool in_stack_ffffffffffffffe7;
  
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RSI,0);
  try_convert_and_check<const_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_const_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>,_0UL>
  ::convert(in_stack_00000100);
  std::function<bool_(const_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
  operator()((function<bool_(const_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
              *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),in_RDI);
  pbVar1 = type_convertor<bool,_bool>::convert<bool>((bool *)&stack0xffffffffffffffe7);
  return (bool)(*pbVar1 & 1);
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}